

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalFilterAndGroup.cpp
# Opt level: O1

bool __thiscall IntervalFilterAndGroup::accepts(IntervalFilterAndGroup *this,Interval *interval)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  shared_ptr<IntervalFilter> *filter;
  pointer psVar6;
  
  bVar3 = IntervalFilter::is_done(&this->super_IntervalFilter);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    psVar1 = (this->_filters).
             super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (this->_filters).
                  super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar3 = psVar6 == psVar1, !bVar3;
        psVar6 = psVar6 + 1) {
      peVar2 = (psVar6->super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar5 = (**peVar2->_vptr_IntervalFilter)(peVar2,interval);
      if ((char)iVar5 == '\0') {
        bVar4 = IntervalFilter::is_done
                          ((psVar6->super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        if (!bVar4) {
          return bVar3;
        }
        IntervalFilter::set_done(&this->super_IntervalFilter,true);
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool IntervalFilterAndGroup::accepts (const Interval& interval)
{
  if (is_done ())
  {
    return false;
  }

  for (auto& filter: _filters)
  {
    if (filter->accepts (interval))
    {
      continue;
    }

    if (filter->is_done ())
    {
      set_done (true);
    }

    return false;
  }

  return true;
}